

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_skeletons.cpp
# Opt level: O0

void icu_63::number::impl::blueprint_helpers::parseFractionStem
               (StringSegment *segment,MacroProps *macros,UErrorCode *status)

{
  int32_t iVar1;
  char16_t cVar2;
  int32_t iVar3;
  FractionPrecision local_70;
  FractionPrecision local_50;
  int local_2c;
  int local_28;
  int32_t maxFrac;
  int32_t minFrac;
  int32_t offset;
  UErrorCode *status_local;
  MacroProps *macros_local;
  StringSegment *segment_local;
  
  maxFrac = 1;
  local_28 = 0;
  _minFrac = status;
  status_local = (UErrorCode *)macros;
  macros_local = (MacroProps *)segment;
  while ((iVar1 = maxFrac,
         iVar3 = numparse::impl::StringSegment::length((StringSegment *)macros_local), iVar1 < iVar3
         && (cVar2 = numparse::impl::StringSegment::charAt((StringSegment *)macros_local,maxFrac),
            cVar2 == L'0'))) {
    local_28 = local_28 + 1;
    maxFrac = maxFrac + 1;
  }
  iVar1 = maxFrac;
  iVar3 = numparse::impl::StringSegment::length((StringSegment *)macros_local);
  if (iVar1 < iVar3) {
    cVar2 = numparse::impl::StringSegment::charAt((StringSegment *)macros_local,maxFrac);
    if (cVar2 == L'+') {
      local_2c = -1;
      maxFrac = maxFrac + 1;
    }
    else {
      local_2c = local_28;
      while ((iVar1 = maxFrac,
             iVar3 = numparse::impl::StringSegment::length((StringSegment *)macros_local),
             iVar1 < iVar3 &&
             (cVar2 = numparse::impl::StringSegment::charAt((StringSegment *)macros_local,maxFrac),
             cVar2 == L'#'))) {
        local_2c = local_2c + 1;
        maxFrac = maxFrac + 1;
      }
    }
  }
  else {
    local_2c = local_28;
  }
  iVar1 = maxFrac;
  iVar3 = numparse::impl::StringSegment::length((StringSegment *)macros_local);
  if (iVar1 < iVar3) {
    *_minFrac = U_NUMBER_SKELETON_SYNTAX_ERROR;
  }
  else if (local_2c == -1) {
    Precision::minFraction(&local_50,local_28);
    status_local[0x10] = local_50.super_Precision.fType;
    status_local[0x11] = local_50.super_Precision._4_4_;
    *(FractionSignificantSettings *)(status_local + 0x12) = local_50.super_Precision.fUnion.fracSig;
    *(undefined8 *)(status_local + 0x14) = local_50.super_Precision.fUnion._8_8_;
    status_local[0x16] = local_50.super_Precision.fRoundingMode;
  }
  else {
    Precision::minMaxFraction(&local_70,local_28,local_2c);
    status_local[0x10] = local_70.super_Precision.fType;
    status_local[0x11] = local_70.super_Precision._4_4_;
    *(FractionSignificantSettings *)(status_local + 0x12) = local_70.super_Precision.fUnion.fracSig;
    *(undefined8 *)(status_local + 0x14) = local_70.super_Precision.fUnion._8_8_;
    status_local[0x16] = local_70.super_Precision.fRoundingMode;
  }
  return;
}

Assistant:

void blueprint_helpers::parseFractionStem(const StringSegment& segment, MacroProps& macros,
                                          UErrorCode& status) {
    U_ASSERT(segment.charAt(0) == u'.');
    int32_t offset = 1;
    int32_t minFrac = 0;
    int32_t maxFrac;
    for (; offset < segment.length(); offset++) {
        if (segment.charAt(offset) == u'0') {
            minFrac++;
        } else {
            break;
        }
    }
    if (offset < segment.length()) {
        if (segment.charAt(offset) == u'+') {
            maxFrac = -1;
            offset++;
        } else {
            maxFrac = minFrac;
            for (; offset < segment.length(); offset++) {
                if (segment.charAt(offset) == u'#') {
                    maxFrac++;
                } else {
                    break;
                }
            }
        }
    } else {
        maxFrac = minFrac;
    }
    if (offset < segment.length()) {
        // throw new SkeletonSyntaxException("Invalid fraction stem", segment);
        status = U_NUMBER_SKELETON_SYNTAX_ERROR;
        return;
    }
    // Use the public APIs to enforce bounds checking
    if (maxFrac == -1) {
        macros.precision = Precision::minFraction(minFrac);
    } else {
        macros.precision = Precision::minMaxFraction(minFrac, maxFrac);
    }
}